

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall t_swift_generator::generate_typedef(t_swift_generator *this,t_typedef *ttypedef)

{
  ostream *poVar1;
  string *psVar2;
  t_type *ttype;
  string local_68;
  string local_38;
  t_typedef *local_18;
  t_typedef *ttypedef_local;
  t_swift_generator *this_local;
  
  local_18 = ttypedef;
  ttypedef_local = (t_typedef *)this;
  t_generator::indent_abi_cxx11_(&local_38,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)&this->f_decl_,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"public typealias ");
  psVar2 = t_typedef::get_symbolic_abi_cxx11_(local_18);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1," = ");
  ttype = t_typedef::get_type(local_18);
  type_name_abi_cxx11_(&local_68,this,ttype,false,false);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<((ostream *)&this->f_decl_,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_typedef(t_typedef* ttypedef) {
  f_decl_ << indent() << "public typealias " << ttypedef->get_symbolic()
          << " = " << type_name(ttypedef->get_type()) << endl;
  f_decl_ << endl;
}